

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_write_jp(opj_jp2_t *jp2,opj_stream_private_t *cio,opj_event_mgr_t *p_manager)

{
  OPJ_SIZE_T OVar1;
  OPJ_BYTE l_signature_data [12];
  
  if (cio == (opj_stream_private_t *)0x0) {
    __assert_fail("cio != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x749,
                  "OPJ_BOOL opj_jp2_write_jp(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      opj_write_bytes_LE(l_signature_data,0xc,4);
      opj_write_bytes_LE(l_signature_data + 4,0x6a502020,4);
      opj_write_bytes_LE(l_signature_data + 8,0xd0a870a,4);
      OVar1 = opj_stream_write_data(cio,l_signature_data,0xc,p_manager);
      return (OPJ_BOOL)(OVar1 == 0xc);
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x74b,
                  "OPJ_BOOL opj_jp2_write_jp(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                ,0x74a,
                "OPJ_BOOL opj_jp2_write_jp(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_jp2_write_jp(opj_jp2_t *jp2,
                                 opj_stream_private_t *cio,
                                 opj_event_mgr_t * p_manager)
{
    /* 12 bytes will be read */
    OPJ_BYTE l_signature_data [12];

    /* preconditions */
    assert(cio != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    OPJ_UNUSED(jp2);

    /* write box length */
    opj_write_bytes(l_signature_data, 12, 4);
    /* writes box type */
    opj_write_bytes(l_signature_data + 4, JP2_JP, 4);
    /* writes magic number*/
    opj_write_bytes(l_signature_data + 8, 0x0d0a870a, 4);

    if (opj_stream_write_data(cio, l_signature_data, 12, p_manager) != 12) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}